

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall testing::internal::UnitTestImpl::test_case_to_run_count(UnitTestImpl *this)

{
  int iVar1;
  pointer ppTVar2;
  long in_FS_OFFSET;
  
  iVar1 = 0;
  for (ppTVar2 = (this->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar2 !=
      (this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar2 = ppTVar2 + 1) {
    iVar1 = iVar1 + (uint)(*ppTVar2)->should_run_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int UnitTestImpl::test_case_to_run_count() const {
  return CountIf(test_cases_, ShouldRunTestCase);
}